

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::classify_elements(Mesh *mesh)

{
  Int ent_dim;
  LO size_in;
  Int IVar1;
  allocator local_79;
  string local_78 [32];
  Read<signed_char> local_58 [2];
  allocator local_31;
  string local_30 [32];
  Mesh *local_10;
  Mesh *mesh_local;
  
  local_10 = mesh;
  ent_dim = Mesh::dim(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"class_dim",&local_31);
  size_in = Mesh::nelems(local_10);
  IVar1 = Mesh::dim(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Read<signed_char>::Read(local_58,size_in,(char)IVar1,(string *)local_78);
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)local_30,1,local_58,false);
  Read<signed_char>::~Read(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void classify_elements(Mesh* mesh) {
  mesh->add_tag<I8>(mesh->dim(), "class_dim", 1,

      Read<I8>(mesh->nelems(), static_cast<I8>(mesh->dim())));
}